

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

basic_string<char,_eastl::allocator> * __thiscall
eastl::basic_string<char,_eastl::allocator>::assign
          (basic_string<char,_eastl::allocator> *this,value_type *pBegin,value_type *pEnd)

{
  value_type *__dest;
  long lVar1;
  size_t __n;
  size_t __n_00;
  
  __n_00 = (long)pEnd - (long)pBegin;
  __dest = this->mpBegin;
  __n = (long)this->mpEnd - (long)__dest;
  if ((uint)__n < (uint)__n_00) {
    memmove(__dest,pBegin,__n);
    append(this,pBegin + (uint)(*(int *)&this->mpEnd - *(int *)&this->mpBegin),pEnd);
  }
  else {
    memmove(__dest,pBegin,__n_00);
    lVar1 = (long)(this->mpBegin + __n_00) - (long)this->mpEnd;
    if (lVar1 != 0) {
      this->mpBegin[__n_00] = *this->mpEnd;
      this->mpEnd = this->mpEnd + lVar1;
    }
  }
  return this;
}

Assistant:

basic_string<T, Allocator>& basic_string<T, Allocator>::assign(const value_type* pBegin, const value_type* pEnd)
    {
        const ptrdiff_t n = pEnd - pBegin;
        if(static_cast<size_type>(n) <= (size_type)(mpEnd - mpBegin))
        {
            memmove(mpBegin, pBegin, (size_t)n * sizeof(value_type));
            erase(mpBegin + n, mpEnd);
        }
        else
        {
            memmove(mpBegin, pBegin, (size_t)(mpEnd - mpBegin) * sizeof(value_type));
            append(pBegin + (size_type)(mpEnd - mpBegin), pEnd);
        }
        return *this;
    }